

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfXdr.h
# Opt level: O1

void Imf_3_4::Xdr::skip<Imf_3_4::StreamIO,Imf_3_4::IStream>(IStream *in,int n)

{
  bool bVar1;
  int iVar2;
  char c [1024];
  undefined1 auStack_418 [1024];
  
  iVar2 = n;
  if (0x3ff < n) {
    do {
      iVar2 = (*in->_vptr_IStream[3])(in,auStack_418,0x400);
      if ((char)iVar2 == '\0') {
        return;
      }
      iVar2 = n + -0x400;
      bVar1 = 0x7ff < n;
      n = iVar2;
    } while (bVar1);
  }
  if (0 < iVar2) {
    (*in->_vptr_IStream[3])(in,auStack_418);
  }
  return;
}

Assistant:

void
skip (T& in, int n) // skip n padding bytes
{
    char c[1024];

    while (n >= (int) sizeof (c))
    {
        if (!S::readChars (in, c, sizeof (c))) return;

        n -= sizeof (c);
    }

    if (n >= 1) S::readChars (in, c, n);
}